

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hole.c
# Opt level: O1

zip_source_t * open_file(char *fname)

{
  int iVar1;
  zip_source_t *pzVar2;
  long lVar3;
  long lVar4;
  char *pcVar5;
  undefined1 *puVar6;
  zip_error_t error;
  undefined1 auStack_2050 [8200];
  char *pcStack_48;
  undefined1 local_20 [16];
  
  zip_error_init(local_20);
  pzVar2 = (zip_source_t *)zip_source_file_create(fname,0,0,local_20);
  if (pzVar2 != (zip_source_t *)0x0) {
    return pzVar2;
  }
  puVar6 = local_20;
  pcVar5 = fname;
  open_file_cold_1();
  pcStack_48 = fname;
  iVar1 = zip_source_open();
  if (iVar1 < 0) {
    copy_source_cold_5();
  }
  else {
    iVar1 = zip_source_begin_write(pcVar5);
    if (iVar1 < 0) {
      copy_source_cold_4();
    }
    else {
      do {
        lVar3 = zip_source_read(puVar6,auStack_2050,0x2000);
        if (lVar3 < 1) {
          if (lVar3 < 0) {
            copy_source_cold_2();
            return (zip_source_t *)0xffffffff;
          }
          zip_source_close(puVar6);
          iVar1 = zip_source_commit_write(pcVar5);
          if (iVar1 < 0) {
            copy_source_cold_1();
            return (zip_source_t *)0xffffffff;
          }
          return (zip_source_t *)0x0;
        }
        lVar4 = zip_source_write(pcVar5,auStack_2050,lVar3);
      } while (lVar4 == lVar3);
      copy_source_cold_3();
    }
  }
  return (zip_source_t *)0xffffffff;
}

Assistant:

static zip_source_t *
open_file(const char *fname) {
    zip_error_t error;
    zip_source_t *src;

    zip_error_init(&error);

    if ((src = zip_source_file_create(fname, 0, 0, &error)) == NULL) {
	fprintf(stderr, "%s: can't open file %s: %s\n", progname, fname, zip_error_strerror(&error));
	zip_error_fini(&error);
	exit(1);
    }

    return src;
}